

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O0

void putNewParticleIntoRep(Particle *particle,myRep *rep,int iterator)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  undefined1 local_40 [8];
  Rep tmp;
  int i;
  int iterator_local;
  myRep *rep_local;
  Particle *particle_local;
  
  tmp.iterator = iterator;
  for (tmp.sizeOfAddO_origin = 0; tmp.sizeOfAddO_origin < 5;
      tmp.sizeOfAddO_origin = tmp.sizeOfAddO_origin + 1) {
    if (((particle[tmp.sizeOfAddO_origin].dominated & 1U) == 0) &&
       (bVar3 = canPutIntoRep(particle[tmp.sizeOfAddO_origin].Cost,rep), bVar3)) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)particle[tmp.sizeOfAddO_origin].sizeOfAddO_origin;
      uVar4 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      tmp.Cost = (double *)operator_new__(uVar4);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)particle[tmp.sizeOfAddO_origin].sizeOfPosition;
      uVar4 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      tmp.addO_origin = (double *)operator_new__(uVar4);
      uVar4 = SUB168(ZEXT816(1) * ZEXT816(8),0);
      if (SUB168(ZEXT816(1) * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      local_40 = (undefined1  [8])operator_new__(uVar4);
      tmp.Position._0_4_ = particle[tmp.sizeOfAddO_origin].sizeOfAddO_origin;
      tmp.Position._4_4_ = tmp.iterator;
      cpyDoubleArray(&tmp.Cost,&particle[tmp.sizeOfAddO_origin].addO_origin,
                     particle[tmp.sizeOfAddO_origin].sizeOfAddO_origin);
      cpyDoubleArray(&tmp.addO_origin,&particle[tmp.sizeOfAddO_origin].Position,
                     particle[tmp.sizeOfAddO_origin].sizeOfPosition);
      cpyDoubleArray((double **)local_40,&particle[tmp.sizeOfAddO_origin].Cost,1);
      std::__cxx11::list<Rep,_std::allocator<Rep>_>::push_back(rep,(value_type *)local_40);
    }
  }
  return;
}

Assistant:

void putNewParticleIntoRep(Particle * particle, myRep & rep, int iterator){
    for (int i=0; i<nPop; i++)
        if (!particle[i].dominated){
            if (canPutIntoRep(particle[i].Cost, rep)){
                Rep tmp;
                tmp.addO_origin = new double [particle[i].sizeOfAddO_origin];
                tmp.Position = new double [particle[i].sizeOfPosition];
                tmp.Cost = new double [numObjective];
                tmp.sizeOfAddO_origin = particle[i].sizeOfAddO_origin;
                tmp.iterator = iterator;
                cpyDoubleArray(tmp.addO_origin, particle[i].addO_origin, particle[i].sizeOfAddO_origin);
                cpyDoubleArray(tmp.Position, particle[i].Position, particle[i].sizeOfPosition);
                cpyDoubleArray(tmp.Cost, particle[i].Cost, numObjective);
                rep.push_back(tmp);
            }
        }
}